

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QMovableArrayOps<QTextBlock>::insert
          (QMovableArrayOps<QTextBlock> *this,qsizetype i,qsizetype n,parameter_type t)

{
  int iVar1;
  QTextDocumentPrivate *pQVar2;
  QTextBlock *pQVar3;
  long lVar5;
  long in_FS_OFFSET;
  bool bVar6;
  Inserter local_70;
  QTextBlock local_48;
  long local_38;
  QTextBlock *pQVar4;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = t->p;
  iVar1 = t->n;
  local_48._12_4_ = 0xaaaaaaaa;
  local_48.n = iVar1;
  bVar6 = (this->super_QGenericArrayOps<QTextBlock>).super_QArrayDataPointer<QTextBlock>.size != 0;
  local_48.p = pQVar2;
  QArrayDataPointer<QTextBlock>::detachAndGrow
            ((QArrayDataPointer<QTextBlock> *)this,(uint)(i == 0 && bVar6),n,(QTextBlock **)0x0,
             (QArrayDataPointer<QTextBlock> *)0x0);
  if (i == 0 && bVar6) {
    lVar5 = (this->super_QGenericArrayOps<QTextBlock>).super_QArrayDataPointer<QTextBlock>.size;
    pQVar3 = (this->super_QGenericArrayOps<QTextBlock>).super_QArrayDataPointer<QTextBlock>.ptr;
    while( true ) {
      pQVar4 = pQVar3 + -1;
      lVar5 = lVar5 + 1;
      bVar6 = n == 0;
      n = n + -1;
      if (bVar6) break;
      pQVar4->p = pQVar2;
      pQVar3[-1].n = iVar1;
      (this->super_QGenericArrayOps<QTextBlock>).super_QArrayDataPointer<QTextBlock>.ptr = pQVar4;
      (this->super_QGenericArrayOps<QTextBlock>).super_QArrayDataPointer<QTextBlock>.size = lVar5;
      pQVar3 = pQVar4;
    }
  }
  else {
    Inserter::Inserter(&local_70,(QArrayDataPointer<QTextBlock> *)this,i,n);
    Inserter::insertFill(&local_70,&local_48,n);
    Inserter::~Inserter(&local_70);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void insert(qsizetype i, qsizetype n, parameter_type t)
    {
        T copy(t);

        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, n, nullptr, nullptr);
        Q_ASSERT((pos == Data::GrowsAtBeginning && this->freeSpaceAtBegin() >= n) ||
                 (pos == Data::GrowsAtEnd && this->freeSpaceAtEnd() >= n));

        if (growsAtBegin) {
            // copy construct items in reverse order at the begin
            Q_ASSERT(this->freeSpaceAtBegin() >= n);
            while (n--) {
                new (this->begin() - 1) T(copy);
                --this->ptr;
                ++this->size;
            }
        } else {
            Inserter(this, i, n).insertFill(copy, n);
        }
    }